

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  Item *pIVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Real eps;
  type_conflict5 tVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *this_00;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  int local_164;
  cpp_dec_float<200U,_int,_void> local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar12 = 0;
  uVar11 = (ulong)((long)(x->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(x->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 7;
  iVar10 = (int)uVar11;
  if (iVar10 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    (x->super_IdxSet).num = 0;
  }
  else {
    uVar7 = 0;
    uVar11 = uVar11 & 0xffffffff;
    if (iVar10 < 1) {
      uVar11 = uVar7;
    }
    local_164 = 0;
    for (; lVar5 = 0x1c, uVar7 != uVar11; uVar7 = uVar7 + 1) {
      this_00 = &(x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].m_backend;
      local_138.data._M_elems._0_8_ = local_138.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar3 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)this_00,(int *)&local_138);
      if (tVar3) {
        pcVar8 = this_00;
        pnVar9 = &local_b0;
        for (; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = this_00->exp;
        local_b0.m_backend.neg = this_00->neg;
        local_b0.m_backend.fpclass = this_00->fpclass;
        local_b0.m_backend.prec_elem = this_00->prec_elem;
        eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
        bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_b0,eps);
        if (bVar4) {
          pIVar1 = (A->set).theitem;
          iVar10 = (A->set).thekey[uVar7].idx;
          (x->super_IdxSet).idx[local_164] = (int)uVar7;
          uVar6 = (ulong)(uint)pIVar1[iVar10].data.
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .memused;
          lVar5 = uVar6 * 0x84;
          while( true ) {
            if ((int)uVar6 < 1) break;
            pNVar2 = pIVar1[iVar10].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 0x1c;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems[6] = 0;
            local_138.data._M_elems[7] = 0;
            local_138.data._M_elems[8] = 0;
            local_138.data._M_elems[9] = 0;
            local_138.data._M_elems[10] = 0;
            local_138.data._M_elems[0xb] = 0;
            local_138.data._M_elems[0xc] = 0;
            local_138.data._M_elems[0xd] = 0;
            local_138.data._M_elems[0xe] = 0;
            local_138.data._M_elems[0xf] = 0;
            local_138.data._M_elems[0x10] = 0;
            local_138.data._M_elems[0x11] = 0;
            local_138.data._M_elems[0x12] = 0;
            local_138.data._M_elems[0x13] = 0;
            local_138.data._M_elems[0x14] = 0;
            local_138.data._M_elems[0x15] = 0;
            local_138.data._M_elems[0x16] = 0;
            local_138.data._M_elems[0x17] = 0;
            local_138.data._M_elems[0x18] = 0;
            local_138.data._M_elems[0x19] = 0;
            local_138.data._M_elems._104_5_ = 0;
            local_138.data._M_elems[0x1b]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_138,this_00,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)&pNVar2[-1].val.m_backend.data + lVar5));
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)*(int *)((long)(&pNVar2[-1].val + 1) + lVar5) * 0x80 +
                       *(long *)(this + 0x20)),&local_138);
            uVar6 = (ulong)((int)uVar6 - 1);
            lVar5 = lVar5 + -0x84;
          }
          local_164 = local_164 + 1;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,0);
        }
      }
    }
    (x->super_IdxSet).num = local_164;
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
  }
  x->setupStatus = true;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productAndSetup(const SVSetBase<S>& A, SSVectorBase<T>& x)
{
   assert(!x.isSetup());

   if(x.dim() == 0)
   {
      // x == 0 => this := zero vector
      clear();
      x.num = 0;
   }
   else
   {
      // x is not setup, so walk through its value vector
      int nzcount = 0;
      int end = x.dim();

      for(int i = 0; i < end; ++i)
      {
         // advance to the next element != 0
         T& xval = x.val[i];

         if(xval != 0)
         {
            // If x[i] is really nonzero, compute A[i] * x[i] and adapt x.idx,
            // otherwise set x[i] to 0.
            if(isNotZero(xval, this->tolerances()->epsilon()))
            {
               const SVectorBase<S>& Ai = A[i];
               x.idx[ nzcount++ ] = i;

               for(int j = Ai.size() - 1; j >= 0; --j)
               {
                  const Nonzero<S>& elt = Ai.element(j);
                  VectorBase<R>::val[elt.idx] += xval * elt.val;
               }
            }
            else
               xval = 0;
         }
      }

      x.num = nzcount;
      setupStatus = false;
   }

   x.setupStatus = true;

   assert(isConsistent());

   return *this;
}